

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

void __thiscall
llvm::sys::fs::directory_entry::replace_filename
          (directory_entry *this,Twine *filename,basic_file_status st)

{
  StringRef path_00;
  char *pcVar1;
  pointer in_start;
  char *pcVar2;
  SmallString<128U> path;
  Child local_110;
  undefined8 local_108;
  Child local_100 [2];
  Twine local_f0;
  Twine local_d8;
  SmallVectorImpl<char> local_c0;
  undefined1 local_b0 [128];
  
  in_start = (this->Path)._M_dataplus._M_p;
  pcVar2 = (char *)(this->Path)._M_string_length;
  path_00.Data = (this->Path)._M_dataplus._M_p;
  path_00.Length = (this->Path)._M_string_length;
  pcVar1 = (char *)anon_unknown.dwarf_3f0aff::parent_path_end(path_00,native);
  if (pcVar1 < pcVar2) {
    pcVar2 = pcVar1;
  }
  if (pcVar1 == (char *)0xffffffffffffffff) {
    in_start = (char *)0x0;
    pcVar2 = (char *)0x0;
  }
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  SmallVectorImpl<char>::append<char_const*,void>(&local_c0,in_start,pcVar2 + (long)in_start);
  Twine::Twine((Twine *)&local_110,"");
  Twine::Twine(&local_d8,"");
  Twine::Twine(&local_f0,"");
  sys::path::append(&local_c0,native,filename,(Twine *)&local_110,&local_d8,&local_f0);
  if ((undefined1 *)
      local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX == (undefined1 *)0x0) {
    local_110.twine = (Twine *)local_100;
    local_108 = 0;
    local_100[0].character = '\0';
  }
  else {
    local_110.twine = (Twine *)local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               local_c0.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
               (undefined1 *)
               ((long)local_c0.super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
               (local_c0.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ & 0xffffffff
               )));
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_110.character);
  if (&(local_110.twine)->LHS != local_100) {
    operator_delete(local_110.twine,CONCAT71(local_100[0]._1_7_,local_100[0].character) + 1);
  }
  (this->Status).fs_st_size = st.fs_st_size;
  (this->Status).Type = st.Type;
  (this->Status).Perms = st.Perms;
  (this->Status).fs_st_atime_nsec = st.fs_st_atime_nsec;
  (this->Status).fs_st_mtime_nsec = st.fs_st_mtime_nsec;
  (this->Status).fs_st_uid = st.fs_st_uid;
  (this->Status).fs_st_gid = st.fs_st_gid;
  (this->Status).fs_st_atime = st.fs_st_atime;
  (this->Status).fs_st_mtime = st.fs_st_mtime;
  if ((undefined1 *)
      local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_b0) {
    free(local_c0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void directory_entry::replace_filename(const Twine &filename,
                                       basic_file_status st) {
  SmallString<128> path = path::parent_path(Path);
  path::append(path, filename);
  Path = path.str();
  Status = st;
}